

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void do_laying_hands(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  CClass *this;
  int *piVar4;
  long lVar5;
  CHAR_DATA *in_RDI;
  int chance;
  int heal;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  char arg [4608];
  undefined4 in_stack_ffffffffffffed28;
  int in_stack_ffffffffffffed2c;
  int in_stack_ffffffffffffed30;
  int in_stack_ffffffffffffed34;
  undefined4 in_stack_ffffffffffffed38;
  int in_stack_ffffffffffffed3c;
  char_data *in_stack_ffffffffffffed40;
  int local_1298;
  int local_1294 [2];
  int local_128c;
  undefined2 local_126e;
  short local_126c;
  short local_126a;
  undefined2 local_1268;
  undefined2 local_1266;
  undefined2 local_1264;
  undefined4 local_1250;
  CHAR_DATA *local_1220;
  char local_1218;
  int in_stack_ffffffffffffee2c;
  CHAR_DATA *in_stack_ffffffffffffee30;
  char *in_stack_ffffffffffffff30;
  CHAR_DATA *in_stack_ffffffffffffff38;
  
  iVar3 = get_skill(in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c);
  if (iVar3 != 0) {
    sVar1 = in_RDI->level;
    lVar5 = (long)gsn_laying_hands;
    this = char_data::Class(in_stack_ffffffffffffed40);
    iVar3 = CClass::GetIndex(this);
    if (*(short *)(lVar5 * 0x60 + 0x8daef8 + (long)iVar3 * 2) <= sVar1) {
      one_argument((char *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
                   (char *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
      if (local_1218 == '\0') {
        send_to_char((char *)in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
        return;
      }
      local_1220 = get_char_room(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      if (local_1220 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
        return;
      }
      if (in_RDI == local_1220) {
        send_to_char((char *)in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
        return;
      }
      bVar2 = is_affected(in_RDI,(int)gsn_laying_hands);
      if (bVar2) {
        send_to_char((char *)in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
        return;
      }
      if (in_RDI->mana < 0x23) {
        send_to_char((char *)in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
        return;
      }
      in_RDI->mana = in_RDI->mana - skill_table[gsn_laying_hands].min_mana;
      WAIT_STATE(in_stack_ffffffffffffed40,in_stack_ffffffffffffed3c);
      init_affect((AFFECT_DATA *)0x60fbb7);
      local_126e = 0;
      local_1250 = 7;
      local_126c = gsn_laying_hands;
      local_126a = in_RDI->level;
      local_1268 = 0x30;
      local_1264 = 0;
      local_1266 = 0;
      affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
                     (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
      local_128c = dice(in_stack_ffffffffffffed30,in_stack_ffffffffffffed2c);
      if (in_RDI == local_1220) {
        send_to_char((char *)in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
        return;
      }
      bVar2 = is_evil((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
      if (bVar2) {
        act((char *)in_stack_ffffffffffffed40,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
            (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
            (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
        act((char *)in_stack_ffffffffffffed40,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
            (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
            (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
        act((char *)in_stack_ffffffffffffed40,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
            (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
            (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
        damage_new(victim,(CHAR_DATA *)af.beat_fun,af._92_4_,af._88_4_,af.end_fun._4_4_,
                   af.end_fun._3_1_,af.end_fun._2_1_,arg._24_4_,arg._32_4_,(char *)arg._40_8_);
        return;
      }
      local_1294[0] = local_1220->hit + local_128c;
      local_1298 = (int)local_1220->max_hit;
      piVar4 = std::min<int>(local_1294,&local_1298);
      local_1220->hit = *piVar4;
      act((char *)in_stack_ffffffffffffed40,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
          (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
          (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
      act((char *)in_stack_ffffffffffffed40,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
          (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
          (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
      act((char *)in_stack_ffffffffffffed40,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
          (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
          (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
      dice(in_stack_ffffffffffffed30,in_stack_ffffffffffffed2c);
      bVar2 = check_dispel((int)in_stack_ffffffffffffed40,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                           in_stack_ffffffffffffed34);
      if (bVar2) {
        send_to_char((char *)in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
        act((char *)in_stack_ffffffffffffed40,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
            (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
            (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
      }
      dice(in_stack_ffffffffffffed30,in_stack_ffffffffffffed2c);
      bVar2 = check_dispel((int)in_stack_ffffffffffffed40,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                           in_stack_ffffffffffffed34);
      if (bVar2) {
        send_to_char((char *)in_stack_ffffffffffffed40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
        act((char *)in_stack_ffffffffffffed40,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
            (void *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30),
            (void *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),0);
      }
      dice(in_stack_ffffffffffffed30,in_stack_ffffffffffffed2c);
      bVar2 = check_dispel((int)in_stack_ffffffffffffed40,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                           in_stack_ffffffffffffed34);
      if (!bVar2) {
        return;
      }
      send_to_char((char *)in_stack_ffffffffffffed40,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffed40,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
  return;
}

Assistant:

void do_laying_hands(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim; /* Well not really victim, but keeping it standard varibale anmes */
	AFFECT_DATA af;
	int heal;
	int chance;

	if ((get_skill(ch, gsn_laying_hands) == 0) ||
		(ch->level < skill_table[gsn_laying_hands].skill_level[ch->Class()->GetIndex()]))
	{
		send_to_char("You do not have the ability to divinely heal.\n\r", ch);
		return;
	}

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Give your divine touch to whom?\n\r", ch);
		return;
	}

	if ((victim = get_char_room(ch, arg)) == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch == victim)
	{
		send_to_char("You can't lay hands on yourself.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_laying_hands))
	{
		send_to_char("You may only grant divine healing once per day.\n\r", ch);
		return;
	}

	if (ch->mana < 35)
	{
		send_to_char("You don't have the mana.\n\r", ch);
		return;
	}

	ch->mana -= skill_table[gsn_laying_hands].min_mana;

	WAIT_STATE(ch, skill_table[gsn_laying_hands].beats);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.type = gsn_laying_hands;
	af.level = ch->level;
	af.duration = 48;
	af.modifier = 0;
	af.location = 0;
	affect_to_char(ch, &af);

	heal = dice(ch->level, 12);

	if (ch == victim)
	{
		send_to_char("You cannot lay hands on yourself.\n\r", ch);
		return;
	}

	if (!is_evil(victim))
	{
		victim->hit = std::min(victim->hit + heal, (int)victim->max_hit);
		act("$n lays $s hands upon $N and $N's wounds seem to heal.", ch, nullptr, victim, TO_NOTVICT);
		act("You lay your hands upon $N and $S wounds seem to heal.", ch, nullptr, victim, TO_CHAR);
		act("$n lays $s hands upon you in blessed communication and your wounds heal.", ch, nullptr, victim, TO_VICT);

		if (check_dispel(ch->level - (dice(1, 10)), victim, gsn_poison))
		{
			send_to_char("A warm feeling runs through your body.\n\r", victim);
			act("$n looks much better.", victim, nullptr, nullptr, TO_ROOM);
		}

		if (check_dispel(ch->level - (dice(3, 4)), victim, gsn_plague))
		{
			send_to_char("Your plague sores vanish.\n\r", victim);
			act("$n looks relieved as $s plague sores vanish.", victim, nullptr, nullptr, TO_ROOM);
		}

		if (check_dispel(ch->level - (dice(3, 5)), victim, gsn_blindness))
		{
			send_to_char("You can see again.\n\r", victim);
		}
	}
	else
	{
		act("$n lays $s hands upon $N, and $n's flesh begins to crackle!", ch, nullptr, victim, TO_NOTVICT);
		act("You lay your hands upon $N... and your flesh begins to crackle!", ch, nullptr, victim, TO_CHAR);
		act("$n lays $s hands upon you... and $s flesh begins to crackle!", ch, nullptr, victim, TO_VICT);

		damage_new(ch, ch, heal, gsn_laying_hands, DAM_HOLY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
	}
}